

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swap_file.c
# Opt level: O2

void jpeg_error_exit(j_common_ptr cinfo)

{
  char msg [200];
  
  (*cinfo->err->format_message)(cinfo,msg);
  _p2sc_msg("jpeg_error_exit",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libswap/swap_file.c"
            ,0x81,"$Id: swap_file.c 5113 2014-06-19 15:07:34Z bogdan $",0x12c0,"libjpeg: %s",msg);
  exit(1);
}

Assistant:

static void jpeg_error_exit(j_common_ptr cinfo) {
    char msg[JMSG_LENGTH_MAX];

    /* fatal, subsequent code will not be executed */
    cinfo->err->format_message(cinfo, msg);
    P2SC_Msg(LVL_FATAL_INTERNAL_ERROR, "libjpeg: %s", msg);
/*
    struct my_err_mgr *myerr = (struct my_err_mgr *) cinfo->err;
    longjmp(myerr->setjmp_buffer, 1);
*/
}